

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_integrate.cpp
# Opt level: O0

void __thiscall
numerary::TestIntegrate::test_integrate_simpson::test_method(test_integrate_simpson *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_188;
  basic_cstring<const_char> local_178;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_168;
  assertion_result local_148;
  basic_cstring<const_char> local_130;
  basic_cstring<const_char> local_120;
  allocator<char> local_109;
  string local_108;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_c8;
  assertion_result local_a8;
  basic_cstring<const_char> local_90;
  basic_cstring<const_char> local_80 [2];
  allocator<char> local_59;
  string local_58;
  double local_38;
  double expected_result;
  double b;
  double a;
  double *I;
  double eps;
  test_integrate_simpson *this_local;
  
  I = (double *)0x3e112e0be826d695;
  a = 0.0;
  b = 0.0;
  expected_result = 1.0;
  local_38 = 2.932941969615793;
  eps = (double)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"simpson",&local_59);
  a = (double)Numerary::integrate(test_integrate_function_1,&b,&expected_result,&local_58,
                                  (double *)&I);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/tivole[P]Numerary/test/test_integrate.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_90);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,local_80,0x20,&local_90);
    boost::test_tools::assertion_result::assertion_result
              (&local_a8,ABS(*(double *)a - local_38) <= *(double *)((long)a + 8));
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,"fabs(I[0] - expected_result) <= I[1]",0x24);
    boost::unit_test::operator<<(&local_c8,plVar3,&local_d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e8,
               "/workspace/llm4binary/github/license_c_cmakelists/tivole[P]Numerary/test/test_integrate.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_a8,&local_c8.super_lazy_ostream,&local_e8,0x20,CHECK,CHECK_PRED,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_c8);
    boost::test_tools::assertion_result::~assertion_result(&local_a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  b = -1.0;
  expected_result = 1.0;
  local_38 = 0.8414709848078965;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"simpson",&local_109);
  a = (double)Numerary::integrate(test_integrate_function_2,&b,&expected_result,&local_108,
                                  (double *)&I);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,
               "/workspace/llm4binary/github/license_c_cmakelists/tivole[P]Numerary/test/test_integrate.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_130);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_120,0x28,&local_130);
    boost::test_tools::assertion_result::assertion_result
              (&local_148,ABS(*(double *)a - local_38) <= *(double *)((long)a + 8));
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_178,"fabs(I[0] - expected_result) <= I[1]",0x24);
    boost::unit_test::operator<<(&local_168,plVar3,&local_178);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/tivole[P]Numerary/test/test_integrate.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_148,&local_168.super_lazy_ostream,&local_188,0x28,CHECK,CHECK_PRED,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_168);
    boost::test_tools::assertion_result::~assertion_result(&local_148);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  if (a != 0.0) {
    operator_delete__((void *)a);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_integrate_simpson)
    {
        const double eps = 1e-9;
        double *I = NULL;
        double a, b;
        double expected_result;

        // Testing \int_{0}^{1}\left(\5x^3 + 2cos(x)\right) dx
        a = 0.0;
        b = 1.0;
        expected_result = 2.93294196961579301330500464;
        I = Numerary::integrate(test_integrate_function_1, a, b, "simpson", eps);
        BOOST_CHECK(fabs(I[0] - expected_result) <= I[1]);


        // Testing \int_{-1}^{1} \left( \frac{\cos x}{1 +e^{\frac{1}{x}}} \right)
        a = -1.0;
        b = 1.0;
        expected_result = 0.8414709848078965066525023;
        I = Numerary::integrate(test_integrate_function_2, a, b, "simpson", eps);
        BOOST_CHECK(fabs(I[0] - expected_result) <= I[1]);

        delete[] I;
    }